

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::updateRanges
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel)

{
  size_t off;
  CppGenerator *this_00;
  string depthString;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::to_string(&local_450,depth);
  off = depth + 3;
  offset_abi_cxx11_(&local_390,this,off);
  std::operator+(&local_370,&local_390,"while(upperptr_");
  std::operator+(&local_350,&local_370,rel_name);
  std::operator+(&local_330,&local_350,"[");
  std::operator+(&local_310,&local_330,&local_450);
  std::operator+(&local_2f0,&local_310,"]<");
  this_00 = (CppGenerator *)rel_name;
  std::__cxx11::string::string((string *)&local_3d0,(string *)rel_name);
  getUpperPointer(&local_3b0,this_00,&local_3d0,depth,parallel);
  std::operator+(&local_2d0,&local_2f0,&local_3b0);
  std::operator+(&local_2b0,&local_2d0," && ");
  std::operator+(&local_290,&local_2b0,rel_name);
  std::operator+(&local_270,&local_290,"[upperptr_");
  std::operator+(&local_250,&local_270,rel_name);
  std::operator+(&local_230,&local_250,"[");
  std::operator+(&local_210,&local_230,&local_450);
  std::operator+(&local_1f0,&local_210,"]+1].");
  std::operator+(&local_1d0,&local_1f0,attr_name);
  std::operator+(&local_1b0,&local_1d0," == max_");
  std::operator+(&local_190,&local_1b0,attr_name);
  std::operator+(&local_170,&local_190,")\n");
  offset_abi_cxx11_(&local_3f0,this,off);
  std::operator+(&local_150,&local_170,&local_3f0);
  std::operator+(&local_130,&local_150,"{\n");
  offset_abi_cxx11_(&local_410,this,depth + 4);
  std::operator+(&local_110,&local_130,&local_410);
  std::operator+(&local_f0,&local_110,"++upperptr_");
  std::operator+(&local_d0,&local_f0,rel_name);
  std::operator+(&local_b0,&local_d0,"[");
  std::operator+(&local_90,&local_b0,&local_450);
  std::operator+(&local_70,&local_90,"];\n");
  offset_abi_cxx11_(&local_430,this,off);
  std::operator+(&local_50,&local_70,&local_430);
  std::operator+(__return_storage_ptr__,&local_50,"}\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_450);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::updateRanges(size_t depth, const std::string& rel_name,
                                       const std::string& attr_name, bool parallel)
{
    std::string depthString = std::to_string(depth);
    return offset(3+depth)+
        //while statementnd
        "while(upperptr_"+rel_name+"["+depthString+"]<"+
        getUpperPointer(rel_name, depth, parallel)+" && "+
        rel_name+"[upperptr_"+rel_name+"["+depthString+"]+1]."+
        attr_name+" == max_"+attr_name+")\n"+
        //body
        offset(3+depth)+"{\n"+
        offset(4+depth)+"++upperptr_"+rel_name+"["+depthString+"];\n"+
        offset(3+depth)+"}\n";
}